

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  bool bVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char>_>_>
  this_00;
  ClassNameResolver *this_01;
  FileDescriptor *this_02;
  string_view classname;
  FileDescriptor *file_local;
  string local_38;
  
  this_01 = (ClassNameResolver *)&file_local;
  file_local = file;
  this_00 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
            ::
            operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
                        *)&this->file_immutable_outer_class_names_,
                       (key_arg<const_google::protobuf::FileDescriptor_*> *)this_01);
  if (this_00->_M_string_length == 0) {
    if ((*(byte *)((long)&file_local->options_->field_0 + 0x18) & 2) == 0) {
      GetFileDefaultImmutableClassName_abi_cxx11_(&local_38,this_01,file_local);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      this_02 = file_local;
      bVar1 = java::anon_unknown_0::UseOldFileClassNameDefault(file_local);
      if (bVar1) {
        classname._M_str = (this_00->_M_dataplus)._M_p;
        classname._M_len = this_00->_M_string_length;
        bVar1 = HasConflictingClassName
                          ((ClassNameResolver *)this_02,file_local,classname,EXACT_EQUAL);
        if (bVar1) {
          std::__cxx11::string::append((char *)this_00);
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)this_00);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileImmutableClassName(
    const FileDescriptor* file) {
  std::string& class_name = file_immutable_outer_class_names_[file];
  if (class_name.empty()) {
    if (file->options().has_java_outer_classname()) {
      class_name = file->options().java_outer_classname();
    } else {
      class_name = GetFileDefaultImmutableClassName(file);

      // This disambiguation logic is deprecated and only enabled when using
      // the old default scheme.
      if (UseOldFileClassNameDefault(file) &&
          HasConflictingClassName(file, class_name,
                                  NameEquality::EXACT_EQUAL)) {
        class_name += kOuterClassNameSuffix;
      }
    }
  }
  return class_name;
}